

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepImageLevel::insertChannel
          (DeepImageLevel *this,string *name,PixelType type,int xSampling,int ySampling,bool pLinear
          )

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this_00;
  mapped_type pDVar3;
  mapped_type *ppDVar4;
  int in_ECX;
  int in_EDX;
  string *in_RSI;
  int in_R8D;
  stringstream _iex_throw_s;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
  *in_stack_fffffffffffffdd8;
  DeepImageLevel *in_stack_fffffffffffffdf8;
  TypedDeepImageChannel<Imath_3_2::half> *in_stack_fffffffffffffe00;
  key_type *in_stack_fffffffffffffe18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
  *in_stack_fffffffffffffe20;
  _Self local_1c8;
  _Self local_1c0 [3];
  stringstream local_1a8 [16];
  ostream local_198 [288];
  string *in_stack_ffffffffffffff88;
  ImageLevel *in_stack_ffffffffffffff90;
  
  if ((in_ECX != 1) && (in_R8D != 1)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"Cannot create deep image channel ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2," with x sampling rate ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ECX);
    poVar2 = std::operator<<(poVar2," and and y sampling rate ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_R8D);
    std::operator<<(poVar2,". X and y sampling rates for deep channels must be 1.");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this_00,local_1a8);
    __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  local_1c0[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
       ::find(in_stack_fffffffffffffdd8,(key_type *)0x127f6e);
  local_1c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
       ::end(in_stack_fffffffffffffdd8);
  bVar1 = std::operator!=(local_1c0,&local_1c8);
  if (bVar1) {
    ImageLevel::throwChannelExists(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (in_EDX == 0) {
    pDVar3 = (mapped_type)operator_new(0x48);
    TypedDeepImageChannel<unsigned_int>::TypedDeepImageChannel
              ((TypedDeepImageChannel<unsigned_int> *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdf8,SUB41((uint)in_EDX >> 0x18,0));
    ppDVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
              ::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    *ppDVar4 = pDVar3;
  }
  else if (in_EDX == 1) {
    pDVar3 = (mapped_type)operator_new(0x48);
    TypedDeepImageChannel<Imath_3_2::half>::TypedDeepImageChannel
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,SUB41((uint)in_EDX >> 0x18,0));
    ppDVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
              ::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    *ppDVar4 = pDVar3;
  }
  else if (in_EDX == 2) {
    pDVar3 = (mapped_type)operator_new(0x48);
    TypedDeepImageChannel<float>::TypedDeepImageChannel
              ((TypedDeepImageChannel<float> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               SUB41((uint)in_EDX >> 0x18,0));
    ppDVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
              ::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    *ppDVar4 = pDVar3;
  }
  return;
}

Assistant:

void
DeepImageLevel::insertChannel (
    const string& name,
    PixelType     type,
    int           xSampling,
    int           ySampling,
    bool          pLinear)
{
    if (xSampling != 1 && ySampling != 1)
    {
        THROW (
            ArgExc,
            "Cannot create deep image channel "
                << name
                << " "
                   "with x sampling rate "
                << xSampling
                << " and "
                   "and y sampling rate "
                << ySampling
                << ". X and y "
                   "sampling rates for deep channels must be 1.");
    }

    if (_channels.find (name) != _channels.end ()) throwChannelExists (name);

    switch (type)
    {
        case HALF:
            _channels[name] = new DeepHalfChannel (*this, pLinear);
            break;

        case FLOAT:
            _channels[name] = new DeepFloatChannel (*this, pLinear);
            break;

        case UINT:
            _channels[name] = new DeepUIntChannel (*this, pLinear);
            break;

        default: assert (false);
    }
}